

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::OP_ScopedDeleteFld<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementScopedC<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  PropertyId propertyId;
  FrameDisplay *pScope;
  Var pvVar1;
  ScriptContext *scriptContext;
  Var result;
  OpLayoutT_ElementScopedC<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  pScope = GetEnvForEvalCode(this);
  propertyId = FunctionBody::GetReferencedPropertyId
                         (*(FunctionBody **)(this + 0x88),(uint)playout->PropertyIdIndex);
  pvVar1 = GetReg<unsigned_int>(this,1);
  scriptContext = GetScriptContext(this);
  pvVar1 = Js::JavascriptOperators::OP_DeletePropertyScoped
                     (pScope,propertyId,pvVar1,scriptContext,PropertyOperation_None);
  SetReg<unsigned_short>(this,playout->Value,pvVar1);
  return;
}

Assistant:

void InterpreterStackFrame::OP_ScopedDeleteFld(const unaligned OpLayoutT_ElementScopedC<T> * playout)
    {
        // Implicit root object as default instance
        Var result = JavascriptOperators::OP_DeletePropertyScoped(GetEnvForEvalCode(),
            m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex),
            GetReg(Js::FunctionBody::RootObjectRegSlot), GetScriptContext());
        SetReg(playout->Value, result);
    }